

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O0

ngx_http_fastcgi_ctx_t *
ngx_http_fastcgi_split(ngx_http_request_t *r,ngx_http_fastcgi_loc_conf_t *flcf)

{
  int iVar1;
  undefined1 local_58 [8];
  int captures [9];
  ngx_int_t n;
  ngx_http_fastcgi_ctx_t *f;
  ngx_http_fastcgi_loc_conf_t *flcf_local;
  ngx_http_request_t *r_local;
  
  n = (ngx_int_t)r->ctx[ngx_http_fastcgi_module.ctx_index];
  if ((void *)n == (void *)0x0) {
    n = (ngx_int_t)ngx_pcalloc(r->pool,0x70);
    if ((void *)n == (void *)0x0) {
      return (ngx_http_fastcgi_ctx_t *)0x0;
    }
    r->ctx[ngx_http_fastcgi_module.ctx_index] = (void *)n;
  }
  if (*(long *)(n + 0x50) == 0) {
    if (flcf->split_regex == (ngx_regex_t *)0x0) {
      *(size_t *)(n + 0x50) = (r->uri).len;
      *(u_char **)(n + 0x58) = (r->uri).data;
      r_local = (ngx_http_request_t *)n;
    }
    else {
      iVar1 = pcre_exec(flcf->split_regex->code,flcf->split_regex->extra,(r->uri).data,
                        (r->uri).len & 0xffffffff,0,0,local_58,9);
      register0x00000000 = (long)iVar1;
      if (register0x00000000 < 0) {
        if (register0x00000000 == -1) {
          *(size_t *)(n + 0x50) = (r->uri).len;
          *(u_char **)(n + 0x58) = (r->uri).data;
          r_local = (ngx_http_request_t *)n;
        }
        else {
          if (1 < r->connection->log->log_level) {
            ngx_log_error_core(2,r->connection->log,0,
                               "pcre_exec() failed: %i on \"%V\" using \"%V\"",register0x00000000,
                               &r->uri,&flcf->split_name);
          }
          r_local = (ngx_http_request_t *)0x0;
        }
      }
      else {
        *(long *)(n + 0x50) = (long)(captures[1] - captures[0]);
        *(u_char **)(n + 0x58) = (r->uri).data + captures[0];
        *(long *)(n + 0x60) = (long)(captures[3] - captures[2]);
        *(u_char **)(n + 0x68) = (r->uri).data + captures[2];
        r_local = (ngx_http_request_t *)n;
      }
    }
  }
  else {
    r_local = (ngx_http_request_t *)n;
  }
  return (ngx_http_fastcgi_ctx_t *)r_local;
}

Assistant:

static ngx_http_fastcgi_ctx_t *
ngx_http_fastcgi_split(ngx_http_request_t *r, ngx_http_fastcgi_loc_conf_t *flcf)
{
    ngx_http_fastcgi_ctx_t       *f;
#if (NGX_PCRE)
    ngx_int_t                     n;
    int                           captures[(1 + 2) * 3];

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    if (f == NULL) {
        f = ngx_pcalloc(r->pool, sizeof(ngx_http_fastcgi_ctx_t));
        if (f == NULL) {
            return NULL;
        }

        ngx_http_set_ctx(r, f, ngx_http_fastcgi_module);
    }

    if (f->script_name.len) {
        return f;
    }

    if (flcf->split_regex == NULL) {
        f->script_name = r->uri;
        return f;
    }

    n = ngx_regex_exec(flcf->split_regex, &r->uri, captures, (1 + 2) * 3);

    if (n >= 0) { /* match */
        f->script_name.len = captures[3] - captures[2];
        f->script_name.data = r->uri.data + captures[2];

        f->path_info.len = captures[5] - captures[4];
        f->path_info.data = r->uri.data + captures[4];

        return f;
    }

    if (n == NGX_REGEX_NO_MATCHED) {
        f->script_name = r->uri;
        return f;
    }

    ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                  ngx_regex_exec_n " failed: %i on \"%V\" using \"%V\"",
                  n, &r->uri, &flcf->split_name);
    return NULL;

#else

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    if (f == NULL) {
        f = ngx_pcalloc(r->pool, sizeof(ngx_http_fastcgi_ctx_t));
        if (f == NULL) {
            return NULL;
        }

        ngx_http_set_ctx(r, f, ngx_http_fastcgi_module);
    }

    f->script_name = r->uri;

    return f;

#endif
}